

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::Initialize
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZVec<int> *blocksize)

{
  int64_t iVar1;
  int *piVar2;
  long *plVar3;
  long lVar4;
  TPZVec<int> *in_RSI;
  long in_RDI;
  TPZVec<std::complex<float>_> *unaff_retaddr;
  int bsize;
  int64_t neq;
  int64_t ndata;
  int64_t b;
  int64_t nblock;
  TPZVec<int> *in_stack_ffffffffffffff98;
  TPZVec<int> *in_stack_ffffffffffffffa0;
  long *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  long numelem;
  long from;
  complex<float> *copy;
  TPZVec<std::complex<float>_> *this_00;
  long newsize;
  
  newsize = in_RDI;
  iVar1 = TPZVec<int>::NElements(in_RSI);
  TPZVec<int>::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (TPZVec<std::complex<float>_> *)0x0;
  TPZVec<long>::Resize
            ((TPZVec<long> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  from = 0;
  numelem = 0;
  for (copy = (complex<float> *)0x0; (long)copy < iVar1;
      copy = (complex<float> *)((long)&copy->_M_value + 1)) {
    piVar2 = TPZVec<int>::operator[](in_RSI,(int64_t)copy);
    iVar5 = *piVar2;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),(int64_t)copy);
    lVar4 = *plVar3 + (long)(iVar5 * iVar5);
    plVar3 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)(in_RDI + 0x40),(int64_t)((long)&copy->_M_value + 1));
    *plVar3 = lVar4;
    from = iVar5 * iVar5 + from;
    numelem = iVar5 + numelem;
  }
  std::complex<float>::complex((complex<float> *)&stack0xffffffffffffffbc,0.0,0.0);
  TPZVec<std::complex<float>_>::Fill(this_00,copy,from,numelem);
  std::complex<float>::complex((complex<float> *)&stack0xffffffffffffffb4,0.0,0.0);
  TPZVec<std::complex<float>_>::Resize(unaff_retaddr,newsize,(complex<float> *)in_RSI);
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(long *)(in_RDI + 8) = numelem;
  *(long *)(in_RDI + 0x10) = numelem;
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Initialize(const TPZVec<int> &blocksize){
	int64_t nblock = blocksize.NElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Number of blocks \t" << nblock;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	fBlockSize = blocksize;
	fBlockPos.Resize(nblock+1,0); 
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksize[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
#ifdef PZ_LOG
	if(ndata > 10000000)
	{
		std::stringstream sout;
		sout << "Calling fStorage.Resize(ndata,0.) with ndata = " << ndata;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	
	fStorage.Fill(0.,0);
	fStorage.Resize(ndata,0.);
	this->fDecomposed = 0;
	this->fRow = neq;
	this->fCol = neq;
}